

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall btMultiBodyDynamicsWorld::applyGravity(btMultiBodyDynamicsWorld *this)

{
  btVector3 *v;
  uint uVar1;
  btMultiBody *this_00;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int i;
  long lVar5;
  int j;
  int i_00;
  bool bVar6;
  CProfileSample __profile;
  CProfileSample local_4d;
  btScalar local_4c;
  btMultiBodyDynamicsWorld *local_48;
  btVector3 local_40;
  
  btDiscreteDynamicsWorld::applyGravity(&this->super_btDiscreteDynamicsWorld);
  CProfileManager::Start_Profile("btMultiBody addGravity");
  v = &(this->super_btDiscreteDynamicsWorld).m_gravity;
  local_48 = this;
  for (lVar5 = 0; lVar5 < (local_48->m_multiBodies).m_size; lVar5 = lVar5 + 1) {
    this_00 = (local_48->m_multiBodies).m_data[lVar5];
    if (this_00->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = *(int *)(this_00->m_baseCollider + 0xec) == 2;
    }
    uVar1 = (this_00->m_links).m_size;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = 0;
    }
    for (lVar4 = 0; uVar3 * 600 - lVar4 != 0; lVar4 = lVar4 + 600) {
      lVar2 = *(long *)((long)((this_00->m_links).m_data)->m_jointTorque + lVar4 + 0x1c);
      if (lVar2 != 0) {
        bVar6 = (bool)(bVar6 | *(int *)(lVar2 + 0xec) == 2);
      }
    }
    if (!bVar6) {
      local_4c = this_00->m_baseMass;
      local_40 = operator*(v,&local_4c);
      btVector3::operator+=(&this_00->m_baseForce,&local_40);
      for (i_00 = 0; i_00 < (this_00->m_links).m_size; i_00 = i_00 + 1) {
        local_4c = btMultiBody::getLinkMass(this_00,i_00);
        local_40 = operator*(v,&local_4c);
        btMultiBody::addLinkForce(this_00,i_00,&local_40);
      }
    }
  }
  CProfileSample::~CProfileSample(&local_4d);
  return;
}

Assistant:

void btMultiBodyDynamicsWorld::applyGravity()
{
        btDiscreteDynamicsWorld::applyGravity();
#ifdef BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
        BT_PROFILE("btMultiBody addGravity");
        for (int i=0;i<this->m_multiBodies.size();i++)
        {
                btMultiBody* bod = m_multiBodies[i];

                bool isSleeping = false;

                if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
                {
                        isSleeping = true;
                }
                for (int b=0;b<bod->getNumLinks();b++)
                {
                        if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
                                isSleeping = true;
                }

                if (!isSleeping)
                {
                        bod->addBaseForce(m_gravity * bod->getBaseMass());

                        for (int j = 0; j < bod->getNumLinks(); ++j)
                        {
                                bod->addLinkForce(j, m_gravity * bod->getLinkMass(j));
                        }
                }//if (!isSleeping)
        }
#endif //BT_USE_VIRTUAL_CLEARFORCES_AND_GRAVITY
}